

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

void __thiscall
testing::internal::UntypedFunctionMockerBase::UninterestingCallCleanupHandler::
~UninterestingCallCleanupHandler(UninterestingCallCleanupHandler *this)

{
  CallReaction reaction;
  string local_28;
  
  reaction = this->reaction;
  std::__cxx11::stringbuf::str();
  ReportUninterestingCall(reaction,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

~UninterestingCallCleanupHandler() {
    ReportUninterestingCall(reaction, ss.str());
  }